

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O0

QString * __thiscall
ProjectBuilderMakefileGenerator::findProgram(ProjectBuilderMakefileGenerator *this,ProString *prog)

{
  ulong uVar1;
  long lVar2;
  qsizetype qVar3;
  MakefileGenerator *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  int i;
  QString *ret;
  QString path;
  QStringList paths;
  undefined4 in_stack_fffffffffffffef8;
  SplitBehaviorFlags in_stack_fffffffffffffefc;
  undefined7 in_stack_ffffffffffffff00;
  byte in_stack_ffffffffffffff07;
  QByteArray *in_stack_ffffffffffffff08;
  QString *this_00;
  int local_d0;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  QChar local_52;
  char local_50 [24];
  undefined1 local_38 [24];
  QList<QString> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this_00 = in_RDI;
  ProString::toQString((ProString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  uVar1 = QDir::isRelativePath((QString *)in_RDI);
  if ((uVar1 & 1) != 0) {
    local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_20.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    local_20.d.size = -0x5555555555555556;
    qgetenv(local_50);
    QString::QString(this_00,in_stack_ffffffffffffff08);
    QChar::QChar<char,_true>(&local_52,':');
    QFlags<Qt::SplitBehaviorFlags>::QFlags
              ((QFlags<Qt::SplitBehaviorFlags> *)
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc);
    QString::split((QChar)(char16_t)&local_20,(QFlags_conflict *)local_38,(uint)(ushort)local_52.ucs
                  );
    QString::~QString((QString *)0x13c765);
    QByteArray::~QByteArray((QByteArray *)0x13c772);
    local_d0 = 0;
    while( true ) {
      lVar2 = (long)local_d0;
      qVar3 = QList<QString>::size(&local_20);
      if (qVar3 <= lVar2) break;
      local_70 = 0xaaaaaaaaaaaaaaaa;
      local_68 = 0xaaaaaaaaaaaaaaaa;
      local_60 = 0xaaaaaaaaaaaaaaaa;
      QList<QString>::at((QList<QString> *)
                         CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      ::operator+((QString *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                  (char (*) [2])CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      ::operator+((QStringBuilder<const_QString_&,_const_char_(&)[2]> *)
                  CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                  (ProString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<const_QString_&,_const_char_(&)[2]>,_const_ProString_&>
                  *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                       (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      in_stack_ffffffffffffff07 = MakefileGenerator::exists(in_RSI,this_00);
      QString::~QString((QString *)0x13c855);
      bVar4 = (in_stack_ffffffffffffff07 & 1) != 0;
      if (bVar4) {
        QString::operator=(in_RDI,(QString *)&local_70);
      }
      QString::~QString((QString *)0x13c890);
      if (bVar4) break;
      local_d0 = local_d0 + 1;
    }
    QList<QString>::~QList((QList<QString> *)0x13c8bb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString
ProjectBuilderMakefileGenerator::findProgram(const ProString &prog)
{
    QString ret = prog.toQString();
    if(QDir::isRelativePath(ret)) {
        QStringList paths = QString(qgetenv("PATH")).split(':');
        for(int i = 0; i < paths.size(); ++i) {
            QString path = paths.at(i) + "/" + prog;
            if(exists(path)) {
                ret = path;
                break;
            }
        }
    }
    return ret;
}